

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::RemoveOffsetBPM_basic_Test::TestBody(RemoveOffsetBPM_basic_Test *this)

{
  long lVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  undefined1 local_486;
  undefined1 local_485;
  undefined1 local_484;
  allocator_type local_483;
  allocator_type local_482;
  allocator_type local_481;
  allocator_type local_480;
  allocator_type local_47f;
  allocator_type local_47e;
  allocator_type local_47d;
  allocator_type local_47c;
  allocator_type local_47b;
  allocator_type local_47a;
  allocator_type local_479;
  allocator_type local_478;
  allocator_type local_477;
  allocator_type local_476;
  allocator_type local_475;
  int local_474 [5];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_460;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_448;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_430;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_418;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_400;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3e8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3d0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_388;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_370;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_340;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_328;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_310;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2f8;
  uint local_2e0 [10];
  undefined1 *local_2b8;
  uint local_2b0 [6];
  undefined1 *local_298;
  undefined4 local_290;
  undefined1 *local_28c;
  undefined4 local_284;
  Polynomial<uint32_t,_double> polynomial;
  undefined1 *local_248;
  undefined8 uStack_240;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  undefined8 local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  undefined8 local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  undefined8 local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  undefined8 local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  undefined8 local_38;
  
  local_474[4] = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_474 + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_310,__l,&local_475);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bpm,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_310);
  bpm.variables_._M_h._M_element_count = 0x3ff0000000000000;
  local_474[3] = 2;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)(local_474 + 3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_328,__l_00,&local_476);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.variables_._M_h._M_rehash_policy,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_328);
  bpm.each_variable_num_._M_h._M_buckets = (__buckets_ptr)&DAT_4000000000000000;
  local_474[2] = 3;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)(local_474 + 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,__l_01,&local_477);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.each_variable_num_._M_h._M_bucket_count,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340);
  bpm.each_variable_num_._M_h._M_rehash_policy._0_8_ = &DAT_4008000000000000;
  local_474[1] = 4;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)(local_474 + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_358,__l_02,&local_478);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.each_variable_num_._M_h._M_rehash_policy._M_next_resize,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_358);
  bpm.variables_to_integers_._M_h._M_bucket_count = 0x4010000000000000;
  local_2b8 = &DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_2b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_370,__l_03,&local_479);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.variables_to_integers_._M_h._M_before_begin,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_370);
  bpm.variables_to_integers_._M_h._M_rehash_policy._M_next_resize = 0x4028000000000000;
  local_2e0[8] = 1;
  local_2e0[9] = 3;
  __l_04._M_len = 2;
  __l_04._M_array = local_2e0 + 8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_388,__l_04,&local_47a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.variables_to_integers_._M_h._M_single_bucket,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_388);
  bpm.sorted_variables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
  local_2e0[6] = 1;
  local_2e0[7] = 4;
  __l_05._M_len = 2;
  __l_05._M_array = local_2e0 + 6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a0,__l_05,&local_47b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.relabel_flag_for_variables_to_integers_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a0);
  bpm.poly_key_list_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x402c000000000000;
  local_2e0[4] = 2;
  local_2e0[5] = 3;
  __l_06._M_len = 2;
  __l_06._M_array = local_2e0 + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3b8,__l_06,&local_47c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bpm.poly_value_list_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3b8);
  bpm.poly_key_inv_._M_h._M_buckets = (__buckets_ptr)0x4037000000000000;
  local_2e0[2] = 2;
  local_2e0[3] = 4;
  __l_07._M_len = 2;
  __l_07._M_array = local_2e0 + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d0,__l_07,&local_47d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.poly_key_inv_._M_h._M_bucket_count,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d0);
  bpm.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  bpm.poly_key_inv_._M_h._M_rehash_policy._4_4_ = 0x40380000;
  local_2e0[0] = 3;
  local_2e0[1] = 4;
  __l_08._M_len = 2;
  __l_08._M_array = local_2e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3e8,__l_08,&local_47e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.poly_key_inv_._M_h._M_rehash_policy._M_next_resize,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3e8);
  local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_474[0] = 100;
  std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>::pair<int,_true>
            (&local_f0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2f8,local_474);
  local_28c = &DAT_200000001;
  local_284 = 3;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_28c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_400,__l_09,&local_47f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_d0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_400);
  local_b8 = 0x405ec00000000000;
  local_298 = &DAT_200000001;
  local_290 = 4;
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&local_298;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_418,__l_10,&local_480);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_418);
  local_98 = 0x405f000000000000;
  local_2b0[3] = 1;
  local_2b0[4] = 3;
  local_2b0[5] = 4;
  __l_11._M_len = 3;
  __l_11._M_array = local_2b0 + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_430,__l_11,&local_481);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_90,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_430);
  local_78 = 0x4060c00000000000;
  local_2b0[0] = 2;
  local_2b0[1] = 3;
  local_2b0[2] = 4;
  __l_12._M_len = 3;
  __l_12._M_array = local_2b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_448,__l_12,&local_482);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_70,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_448);
  local_58 = 0x406d400000000000;
  local_248 = &DAT_200000001;
  uStack_240 = 0x400000003;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&local_248;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_460,__l_13,&local_483);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_460);
  local_38 = 0x4093480000000000;
  std::
  _Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>const*>
            ((_Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&polynomial,&bpm,&stack0xffffffffffffffd0,0,&local_484,&local_485,&local_486);
  lVar1 = 0x1e0;
  do {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&bpm.variables_._M_h._M_buckets + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_460);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_448);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_430);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_418);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_400);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2f8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3e8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3d0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3b8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3a0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_388);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_370);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_358);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_340);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_328);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_310);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel(&bpm,&polynomial,SPIN);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::RemoveOffset(&bpm);
  StateTestBPMUINT(&bpm);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::~BinaryPolynomialModel(&bpm);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&polynomial._M_h);
  return;
}

Assistant:

TEST(RemoveOffsetBPM, basic) {
   Polynomial<uint32_t, double> polynomial = {
      //linear biases
      {{1}, 1.0}, {{2}, 2.0}, {{3}, 3.0}, {{4}, 4.0},
      //quadratic biases
      {{1, 2}, 12.0}, {{1, 3}, 13.0}, {{1, 4}, 14.0},
      {{2, 3}, 23.0}, {{2, 4}, 24.0},
      {{3, 4}, 34.0},
      //To be removed
      {{}, 100},
      //polynomial biases
      {{1, 2, 3}, 123.0}, {{1, 2, 4}, 124.0}, {{1, 3, 4}, 134.0},
      {{2, 3, 4}, 234.0},
      {{1, 2, 3, 4}, 1234.0}
   };
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   bpm.RemoveOffset();
   
   StateTestBPMUINT(bpm);
}